

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O2

vector<LinkedToken,_std::allocator<LinkedToken>_> * __thiscall
ResponseBase::extractLinksFromLine
          (vector<LinkedToken,_std::allocator<LinkedToken>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  ulong index;
  bool bVar1;
  ulong index_00;
  size_t sVar2;
  size_t sVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  LinkedToken local_160;
  Token local_118;
  char *local_f0;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenEnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  string local_d8;
  string local_b8;
  ulong local_98;
  long local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  string link;
  undefined1 local_50 [8];
  string text;
  
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LinkedToken,_std::allocator<LinkedToken>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  link.field_2._8_8_ = __return_storage_ptr__;
  index_00 = std::__cxx11::string::find((char)line,0x5b);
  while (index_00 != 0xffffffffffffffff) {
    sVar2 = braceEnd(line,index_00,'[',']');
    if ((((sVar2 != 0xffffffffffffffff) && (sVar2 + 2 < line->_M_string_length)) &&
        (index = sVar2 + 1, (line->_M_dataplus)._M_p[index] == '(')) &&
       ((local_98 = sVar2 + 2, sVar3 = braceEnd(line,index,'(',')'), sVar3 != 0xffffffffffffffff &&
        (index < sVar3 && index_00 < sVar2)))) {
      local_90 = index_00 + 1;
      local_88 = sVar3;
      std::__cxx11::string::substr((ulong)local_50,(ulong)line);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_1_>>
                        (local_50,text._M_dataplus._M_p + (long)local_50);
      if (_Var4._M_current != (char *)((long)local_50 + (long)text._M_dataplus._M_p) &&
          (undefined1  [8])_Var4._M_current != local_50) {
        std::__cxx11::string::erase(local_50,local_50,_Var4._M_current);
      }
      tokenEnd.current._M_current =
           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )(text._M_dataplus._M_p + (long)local_50);
      local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_50;
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,ResponseBase::extractLinksFromLine(std::__cxx11::string_const&)const::_lambda(char)_2_>
                (&local_f0,&tokenEnd,&local_e0);
      if ((undefined1  [8])local_f0 != local_50 &&
          local_f0 != text._M_dataplus._M_p + (long)local_50) {
        std::__cxx11::string::erase(local_50);
      }
      bVar1 = Token::isToken((string *)local_50);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)line);
        if (local_50 == (undefined1  [8])&text._M_string_length) {
          local_d8.field_2._8_8_ = text.field_2._M_allocated_capacity;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8._M_dataplus._M_p = (pointer)local_50;
        }
        local_d8.field_2._M_allocated_capacity._1_7_ = text._M_string_length._1_7_;
        local_d8.field_2._M_local_buf[0] = (undefined1)text._M_string_length;
        local_d8._M_string_length = (size_type)text._M_dataplus._M_p;
        text._M_dataplus._M_p = (pointer)0x0;
        text._M_string_length._0_1_ = 0;
        local_50 = (undefined1  [8])&text._M_string_length;
        Token::Token(&local_118,&local_d8);
        if (local_80 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&link._M_string_length) {
          local_b8.field_2._8_8_ = link.field_2._M_allocated_capacity;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8._M_dataplus._M_p = (pointer)local_80;
        }
        local_b8.field_2._M_allocated_capacity._1_7_ = link._M_string_length._1_7_;
        local_b8.field_2._M_local_buf[0] = (undefined1)link._M_string_length;
        local_b8._M_string_length = (size_type)link._M_dataplus._M_p;
        link._M_dataplus._M_p = (pointer)0x0;
        link._M_string_length._0_1_ = 0;
        local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&link._M_string_length;
        LinkedToken::LinkedToken(&local_160,&local_118,&local_b8);
        std::vector<LinkedToken,_std::allocator<LinkedToken>_>::emplace_back<LinkedToken>
                  ((vector<LinkedToken,_std::allocator<LinkedToken>_> *)link.field_2._8_8_,
                   &local_160);
        LinkedToken::~LinkedToken(&local_160);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    index_00 = std::__cxx11::string::find((char)line,0x5b);
  }
  return (vector<LinkedToken,_std::allocator<LinkedToken>_> *)link.field_2._8_8_;
}

Assistant:

std::vector<LinkedToken> extractLinksFromLine(const std::string& line) const { // TODO needs some love
        std::vector<LinkedToken> links;

        for (size_t textBegin = line.find('['); textBegin != std::string::npos; textBegin = line.find('[', textBegin + 1)) {
            const size_t textEnd = braceEnd(line, textBegin, '[', ']');
            if (textEnd == std::string::npos) {
                continue;
            }

            size_t linkBegin = textEnd + 1;
            if ((line.length() > textEnd + 2) and (line[linkBegin] == '(')) {
                const size_t linkEnd = braceEnd(line, linkBegin, '(', ')');
                if (linkEnd == -1) {
                    continue;
                }

                textBegin++;
                linkBegin++;

                if ((textBegin > textEnd) or (linkBegin > linkEnd) or (textEnd > linkBegin)) {
                    continue;
                }

                std::string text = line.substr(textBegin, textEnd - textBegin);
                const auto tokenBegin = std::find_if(text.begin(), text.end(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenBegin != text.begin()) and (tokenBegin != text.end())) {
                    text.erase(text.begin(), tokenBegin);
                }

                const auto tokenEnd = std::find_if(text.rbegin(), text.rend(), [](char c) {
                    return canBePartOfIdentifier(c);
                });
                if ((tokenEnd != text.rbegin()) and (tokenEnd != text.rend())) {
                    text.erase(tokenEnd.base(), text.end());
                }

                if (Token::isToken(text)) {
                    std::string link = line.substr(linkBegin, linkEnd - linkBegin);
                    links.push_back(LinkedToken(Token(std::move(text)), std::move(link)));
                }
            }
        }

        return links;
    }